

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1180eec::HandleAsciiCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  int iVar1;
  ulong uVar2;
  pointer pbVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string output;
  string error;
  char *local_b8;
  size_t local_b0;
  char local_a8;
  undefined7 uStack_a7;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  long local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  pointer local_68;
  cmExecutionStatus *local_60;
  string *local_58;
  string local_50;
  
  local_68 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)local_68 -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_98._M_len = (size_t)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"No output variable specified","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((long *)local_98._M_len != &local_88) {
      operator_delete((void *)local_98._M_len,local_88 + 1);
    }
    bVar5 = false;
  }
  else {
    local_b8 = &local_a8;
    local_b0 = 0;
    local_a8 = '\0';
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar5 = ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 1U < 2;
    local_60 = status;
    if (!bVar5) {
      local_58 = (string *)&status->Error;
      uVar2 = 1;
      lVar4 = 0x20;
      do {
        iVar1 = atoi(*(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar4));
        if (iVar1 - 1U < 0xff) {
          std::__cxx11::string::push_back((char)&local_b8);
        }
        else {
          local_80 = *(undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4);
          local_88 = *(long *)((long)&pbVar3->_M_string_length + lVar4);
          local_98._M_len = 0x14;
          local_98._M_str = "Character with code ";
          local_78 = 0x10;
          local_70 = " does not exist.";
          views._M_len = 3;
          views._M_array = &local_98;
          cmCatViews_abi_cxx11_(&local_50,views);
          std::__cxx11::string::_M_assign(local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (0xfe < iVar1 - 1U) goto LAB_00354a50;
        uVar2 = uVar2 + 1;
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x20;
        bVar6 = uVar2 < ((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) - 1U
        ;
        bVar5 = !bVar6;
      } while (bVar6);
    }
    value._M_str = local_b8;
    value._M_len = local_b0;
    cmMakefile::AddDefinition(local_60->Makefile,local_68 + -1,value);
LAB_00354a50:
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool HandleAsciiCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("No output variable specified");
    return false;
  }
  std::string::size_type cc;
  std::string const& outvar = args.back();
  std::string output;
  for (cc = 1; cc < args.size() - 1; cc++) {
    int ch = atoi(args[cc].c_str());
    if (ch > 0 && ch < 256) {
      output += static_cast<char>(ch);
    } else {
      std::string error =
        cmStrCat("Character with code ", args[cc], " does not exist.");
      status.SetError(error);
      return false;
    }
  }
  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}